

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O1

void __thiscall
duckdb::FirstFunctionStringBase<true,false>::SetValue<duckdb::FirstState<duckdb::string_t>,false>
          (FirstFunctionStringBase<true,false> *this,FirstState<duckdb::string_t> *state,
          AggregateInputData *input_data,string_t value,bool is_null)

{
  undefined4 uVar1;
  undefined4 *__dest;
  
  if ((((this[0x10] == (FirstFunctionStringBase<true,false>)0x1) &&
       (this[0x11] == (FirstFunctionStringBase<true,false>)0x0)) && (0xc < *(uint *)this)) &&
     (*(void **)(this + 8) != (void *)0x0)) {
    operator_delete__(*(void **)(this + 8));
  }
  this[0x10] = (FirstFunctionStringBase<true,false>)0x1;
  if (value.value._8_1_ == '\0') {
    this[0x11] = (FirstFunctionStringBase<true,false>)0x0;
    if ((uint)input_data < 0xd) {
      *(AggregateInputData **)this = input_data;
      *(void **)(this + 8) = value.value._0_8_;
    }
    else {
      __dest = (undefined4 *)operator_new__((ulong)input_data & 0xffffffff);
      switchD_012dd528::default(__dest,value.value._0_8_,(ulong)input_data & 0xffffffff);
      uVar1 = *__dest;
      *(uint *)this = (uint)input_data;
      *(undefined4 *)(this + 4) = uVar1;
      *(undefined4 **)(this + 8) = __dest;
    }
  }
  else {
    this[0x11] = (FirstFunctionStringBase<true,false>)0x1;
  }
  return;
}

Assistant:

static void SetValue(STATE &state, AggregateInputData &input_data, string_t value, bool is_null) {
		if (LAST && state.is_set) {
			Destroy(state, input_data);
		}
		if (is_null) {
			if (!SKIP_NULLS) {
				state.is_set = true;
				state.is_null = true;
			}
		} else {
			state.is_set = true;
			state.is_null = false;
			if ((COMBINE && !LAST) || value.IsInlined()) {
				// We use the aggregate allocator for 'first', so the allocation is already done when combining
				// Of course, if the value is inlined, we also don't need to allocate
				state.value = value;
			} else {
				// non-inlined string, need to allocate space for it
				auto len = value.GetSize();
				auto ptr = LAST ? new char[len] : char_ptr_cast(input_data.allocator.Allocate(len));
				memcpy(ptr, value.GetData(), len);

				state.value = string_t(ptr, UnsafeNumericCast<uint32_t>(len));
			}
		}
	}